

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolsb.c
# Opt level: O0

int ffpprsb(fitsfile *fptr,long group,LONGLONG firstelem,LONGLONG nelem,char *array,int *status)

{
  int iVar1;
  LONGLONG local_58;
  undefined1 local_49;
  LONGLONG LStack_48;
  char nullvalue;
  long row;
  int *status_local;
  char *array_local;
  LONGLONG nelem_local;
  LONGLONG firstelem_local;
  long group_local;
  fitsfile *fptr_local;
  
  row = (long)status;
  status_local = (int *)array;
  array_local = (char *)nelem;
  nelem_local = firstelem;
  firstelem_local = group;
  group_local = (long)fptr;
  iVar1 = fits_is_compressed_image(fptr,status);
  if (iVar1 == 0) {
    if (firstelem_local < 1) {
      local_58 = 1;
    }
    else {
      local_58 = firstelem_local;
    }
    LStack_48 = local_58;
    ffpclsb((fitsfile *)group_local,2,local_58,nelem_local,(LONGLONG)array_local,
            (char *)status_local,(int *)row);
    fptr_local._4_4_ = *(int *)row;
  }
  else {
    fits_write_compressed_pixels
              ((fitsfile *)group_local,0xc,nelem_local,(LONGLONG)array_local,0,status_local,
               &local_49,(int *)row);
    fptr_local._4_4_ = *(int *)row;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffpprsb( fitsfile *fptr,  /* I - FITS file pointer                      */
            long  group,     /* I - group to write(1 = 1st group)           */
            LONGLONG  firstelem, /* I - first vector element to write(1 = 1st)  */
            LONGLONG  nelem,     /* I - number of values to write               */
            signed char *array, /* I - array of values that are written     */
            int  *status)    /* IO - error status                           */
/*
  Write an array of values to the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being written).
*/
{
    long row;
    signed char nullvalue;

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        fits_write_compressed_pixels(fptr, TSBYTE, firstelem, nelem,
            0, array, &nullvalue, status);
        return(*status);
    }

    row=maxvalue(1,group);

    ffpclsb(fptr, 2, row, firstelem, nelem, array, status);
    return(*status);
}